

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_stfsu(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar2;
  TCGTemp *a2;
  TCGTemp *a1;
  uintptr_t o_1;
  TCGv_i64 arg2;
  TCGv_i64 pTVar3;
  uintptr_t o_3;
  TCGContext_conflict10 *tcg_ctx;
  TCGOpcode opc;
  uintptr_t o_5;
  uintptr_t o;
  TCGv_i64 ret;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  if ((ctx->opcode & 0x1f0000) == 0) {
    gen_exception_err(ctx,0x60,0x21);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  a2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a2 - (long)tcg_ctx_00);
  a1 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  arg2 = (TCGv_i64)(long)(short)uVar1;
  uVar2 = uVar1 >> 0x10 & 0x1f;
  if (uVar2 == 0) {
    pTVar3 = (TCGv_i64)((ulong)arg2 & 0xffffffff);
    if (ctx->sf_mode != false) {
      pTVar3 = arg2;
    }
    opc = INDEX_op_movi_i64;
LAB_00b9cbd1:
    tcg_gen_op2_ppc64(tcg_ctx_01,opc,(TCGArg)(ret + (long)tcg_ctx_01),(TCGArg)pTVar3);
  }
  else {
    if ((uVar1 & 0xffff) == 0) {
      pTVar3 = cpu_gpr[uVar2];
      if (ctx->sf_mode != false) {
        if (pTVar3 == ret) goto LAB_00b9cbd6;
        pTVar3 = pTVar3 + (long)tcg_ctx_01;
        opc = INDEX_op_mov_i64;
        goto LAB_00b9cbd1;
      }
    }
    else {
      tcg_gen_addi_i64_ppc64(tcg_ctx_01,ret,cpu_gpr[uVar2],(int64_t)arg2);
      pTVar3 = ret;
      if (ctx->sf_mode != false) goto LAB_00b9cbd6;
    }
    tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,pTVar3);
  }
LAB_00b9cbd6:
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)a1,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
  gen_qemu_st32fs(ctx,(TCGv_i64)((long)a1 - (long)tcg_ctx_00),ret);
  if (cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] != ret) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,
                      (TCGArg)(cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f] +
                              (long)tcg_ctx_00),(TCGArg)a2);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64
            (tcg_ctx_00,(TCGTemp *)((TCGv_i64)((long)a1 - (long)tcg_ctx_00) + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_stfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    get_fpr(tcg_ctx, t0, rD(ctx->opcode));
    tcg_gen_qemu_st_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_STORE, DEF_MEMOP(MO_Q));
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}